

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_throwable.c
# Opt level: O0

throwable throwable_create(value v)

{
  type_id tVar1;
  value pvVar2;
  value in_RDI;
  throwable inner;
  throwable th;
  value in_stack_00000068;
  value in_stack_ffffffffffffffe0;
  throwable local_8;
  
  local_8 = (throwable)malloc(8);
  if (local_8 == (throwable)0x0) {
    local_8 = (throwable)0x0;
  }
  else {
    if (in_RDI == (value)0x0) {
      pvVar2 = value_create_null();
      local_8->v = pvVar2;
    }
    else {
      tVar1 = value_type_id(in_RDI);
      if (tVar1 == 0x12) {
        value_to_throwable(in_stack_ffffffffffffffe0);
        pvVar2 = value_type_copy(in_stack_00000068);
        local_8->v = pvVar2;
      }
      else {
        local_8->v = in_RDI;
      }
    }
    if (local_8->v == (value)0x0) {
      free(local_8);
      local_8 = (throwable)0x0;
    }
  }
  return local_8;
}

Assistant:

throwable throwable_create(value v)
{
	throwable th = malloc(sizeof(struct throwable_type));

	if (th == NULL)
	{
		return NULL;
	}

	if (v == NULL)
	{
		/* In case of NULL, create a default throwable with a null value */
		th->v = value_create_null();
	}
	else if (value_type_id(v) == TYPE_THROWABLE)
	{
		/* This will flatten the type so it does not enter into a recursive state */
		throwable inner = value_to_throwable(v);

		/* Copy the the value from the throwable passed in the constructor */
		th->v = value_type_copy(inner->v);
	}
	else
	{
		/* Otherwise just set the value (it is supposed to be copied or allocated from outside of this constructor) */
		th->v = v;
	}

	if (th->v == NULL)
	{
		free(th);
		return NULL;
	}

	return th;
}